

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  bool bVar1;
  IMutableContext *pIVar2;
  ostream *poVar3;
  ostream *poVar4;
  Column *col;
  string local_138;
  Column local_118;
  Colour local_e1;
  shared_ptr<const_Catch::IConfig> local_e0 [2];
  Args local_c0;
  undefined1 local_88 [8];
  InternalParseResult result;
  char **argv_local;
  int argc_local;
  Session *this_local;
  
  if ((this->m_startupExceptions & 1U) == 0) {
    result.m_errorMessage.field_2._8_8_ = argv;
    clara::detail::Args::Args(&local_c0,argc,argv);
    clara::detail::ParserBase::parse
              ((InternalParseResult *)local_88,&(this->m_cli).super_ParserBase,&local_c0);
    clara::detail::Args::~Args(&local_c0);
    bVar1 = clara::detail::BasicResult::operator_cast_to_bool((BasicResult *)local_88);
    if (bVar1) {
      if (((this->m_configData).showHelp & 1U) != 0) {
        showHelp(this);
      }
      if (((this->m_configData).libIdentify & 1U) != 0) {
        libIdentify(this);
      }
      clara::std::__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
      this_local._4_4_ = 0;
    }
    else {
      config(this);
      pIVar2 = getCurrentMutableContext();
      std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
                ((shared_ptr<Catch::IConfig_const> *)local_e0,&this->m_config);
      (*(pIVar2->super_IContext)._vptr_IContext[7])
                (pIVar2,(shared_ptr<Catch::IConfig_const> *)local_e0);
      clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr(local_e0);
      poVar3 = cerr();
      Colour::Colour(&local_e1,Red);
      poVar3 = Catch::operator<<(poVar3,&local_e1);
      poVar4 = std::operator<<((ostream *)poVar3,"\nError(s) in input:\n");
      clara::detail::BasicResult<Catch::clara::detail::ParseState>::errorMessage_abi_cxx11_
                (&local_138,(BasicResult<Catch::clara::detail::ParseState> *)local_88);
      clara::TextFlow::Column::Column(&local_118,&local_138);
      col = clara::TextFlow::Column::indent(&local_118,2);
      poVar3 = clara::TextFlow::operator<<((ostream *)poVar4,col);
      std::operator<<((ostream *)poVar3,"\n\n");
      clara::TextFlow::Column::~Column(&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      Colour::~Colour(&local_e1);
      poVar3 = cerr();
      poVar4 = std::operator<<((ostream *)poVar3,"Run with -? for usage\n");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = 0xff;
    }
    clara::detail::BasicResult<Catch::clara::detail::ParseState>::~BasicResult
              ((BasicResult<Catch::clara::detail::ParseState> *)local_88);
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Session::applyCommandLine( int argc, char const * const * argv ) {
        if( m_startupExceptions )
            return 1;

        auto result = m_cli.parse( clara::Args( argc, argv ) );
        if( !result ) {
            config();
            getCurrentMutableContext().setConfig(m_config);
            Catch::cerr()
                << Colour( Colour::Red )
                << "\nError(s) in input:\n"
                << Column( result.errorMessage() ).indent( 2 )
                << "\n\n";
            Catch::cerr() << "Run with -? for usage\n" << std::endl;
            return MaxExitCode;
        }

        if( m_configData.showHelp )
            showHelp();
        if( m_configData.libIdentify )
            libIdentify();
        m_config.reset();
        return 0;
    }